

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::HasSubstrMatcher<std::__cxx11::string>::MatchAndExplain<std::__cxx11::string>
          (HasSubstrMatcher<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
          MatchResultListener *param_2)

{
  pointer pcVar1;
  long lVar2;
  long *local_38 [2];
  long local_28 [2];
  
  pcVar1 = (s->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>((string *)local_38,pcVar1,pcVar1 + s->_M_string_length);
  lVar2 = std::__cxx11::string::find((char *)local_38,*(ulong *)this,0);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return lVar2 != -1;
}

Assistant:

bool MatchAndExplain(const MatcheeStringType& s,
                       MatchResultListener* /* listener */) const {
    return StringType(s).find(substring_) != StringType::npos;
  }